

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O2

void Qentem::Digit::formatStringNumberDefault<Qentem::StringStream<char16_t>>
               (StringStream<char16_t> *stream,SizeT started_at,SizeT32 precision,
               SizeT32 calculated_digits,SizeT32 fraction_length,bool is_positive_exp,bool round_up)

{
  ulong uVar1;
  int iVar2;
  char16_t *pcVar3;
  char16_t *pcVar4;
  SizeT index;
  uint uVar5;
  undefined3 in_register_00000089;
  uint uVar6;
  bool bVar7;
  bool power_increased;
  uint local_3c;
  SizeT local_38;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000089,is_positive_exp);
  pcVar3 = stream->storage_;
  power_increased = false;
  uVar5 = stream->length_ - started_at;
  local_3c = started_at;
  local_38 = started_at;
  if (precision < uVar5) {
    local_3c = stream->length_ + ~precision;
    roundStringNumber<Qentem::StringStream<char16_t>>(stream,&local_3c,&power_increased,round_up);
    if ((char)local_34 != '\0') {
      iVar2 = 1;
      if (precision <= calculated_digits && calculated_digits - precision != 0) {
        iVar2 = calculated_digits - precision;
      }
      uVar6 = ((power_increased | 0xfffffffe) - fraction_length) + iVar2 + uVar5;
      if (precision <= uVar6) {
        index = local_38;
        if (stream->length_ != 0) {
          pcVar3 = pcVar3 + local_3c;
          for (; (pcVar3 < stream->storage_ + (stream->length_ - 1) && (*pcVar3 == L'0'));
              pcVar3 = pcVar3 + 1) {
            local_3c = local_3c + 1;
          }
        }
        goto LAB_0011177c;
      }
    }
  }
  index = local_38;
  uVar6 = 0;
  if (fraction_length != 0) {
    uVar1 = (ulong)local_3c;
    if (stream->length_ != 0) {
      for (pcVar4 = pcVar3 + uVar1;
          (pcVar4 < stream->storage_ + (stream->length_ - 1) && (*pcVar4 == L'0'));
          pcVar4 = pcVar4 + 1) {
        local_3c = (int)uVar1 + 1;
        uVar1 = (ulong)local_3c;
      }
    }
    iVar2 = uVar5 - fraction_length;
    if (uVar5 < fraction_length || iVar2 == 0) {
      uVar6 = fraction_length - uVar5;
      if (fraction_length < uVar5) {
        uVar6 = 0;
      }
      if (power_increased == false) {
        if (3 < uVar6) {
          uVar6 = uVar6 + 1;
          goto LAB_0011177c;
        }
      }
      else {
        if (4 < uVar6 || fraction_length <= uVar5) goto LAB_0011177c;
        uVar6 = uVar6 - 1;
      }
      insertZeros<Qentem::StringStream<char16_t>>(stream,uVar6);
      StringStream<char16_t>::operator+=(stream,L'.');
      StringStream<char16_t>::operator+=(stream,L'0');
      uVar6 = 0;
    }
    else if ((uint)uVar1 < fraction_length + local_38) {
      StringStream<char16_t>::InsertAt(stream,L'.',fraction_length + local_38);
    }
    else {
      if ((power_increased != true) &&
         (uVar6 = (uint)uVar1 - local_38, iVar2 = uVar6 - (uVar5 - calculated_digits),
         uVar6 < uVar5 - calculated_digits)) {
        iVar2 = 0;
      }
      while( true ) {
        uVar5 = (int)uVar1 - 1;
        uVar1 = (ulong)uVar5;
        bVar7 = iVar2 == 0;
        iVar2 = iVar2 + -1;
        uVar6 = 0;
        if (bVar7) break;
        pcVar3[uVar1] = L'0';
        local_3c = uVar5;
      }
    }
  }
LAB_0011177c:
  StringStream<char16_t>::Reverse(stream,index);
  if (local_3c - index <= stream->length_) {
    stream->length_ = stream->length_ - (local_3c - index);
  }
  if (uVar6 != 0) {
    StringStream<char16_t>::InsertAt(stream,L'.',index + 1);
    insertPowerOfTen<Qentem::StringStream<char16_t>>(stream,uVar6,(bool)(char)local_34);
  }
  return;
}

Assistant:

static void formatStringNumberDefault(Stream_T &stream, const SizeT started_at, const SizeT32 precision,
                                          const SizeT32 calculated_digits, SizeT32 fraction_length,
                                          const bool is_positive_exp, const bool round_up) {
        using Char_T                = typename Stream_T::CharType;
        Char_T     *storage         = stream.Storage();
        const SizeT number_length   = (stream.Length() - started_at);
        SizeT       index           = started_at;
        SizeT       power           = 0;
        bool        power_increased = false;
        /////////////////////////////////////////////////////
        if (number_length > precision) {
            --index;
            index += SizeT(number_length - precision);

            roundStringNumber(stream, index, power_increased, round_up);

            if (is_positive_exp) {
                const SizeT diff =
                    SizeT(((number_length - fraction_length) +
                           ((calculated_digits <= precision) ? 0 : (calculated_digits - (precision + SizeT{1})))) -
                          SizeT(!power_increased));

                if (diff >= precision) {
                    Char_T       *number = (storage + index);
                    const Char_T *last   = stream.Last();

                    while ((number < last) && (*number == DigitUtils::DigitChar::Zero)) {
                        ++number;
                        ++index;
                    }

                    power           = diff;
                    fraction_length = 0;
                }
            }
        }

        if (fraction_length != 0) {
            Char_T       *number        = (storage + index);
            const Char_T *last          = stream.Last();
            const SizeT   dot_index     = SizeT(started_at + fraction_length);
            const bool    fraction_only = (number_length <= fraction_length);

            while ((number < last) && (*number == DigitUtils::DigitChar::Zero)) {
                ++number;
                ++index;
            }

            if (fraction_only) {
                const SizeT diff = SizeT((fraction_length > number_length) ? (fraction_length - number_length) : 0);

                if (!power_increased) {
                    if (diff < SizeT{4}) {
                        insertZeros(stream, diff);
                        stream += DigitUtils::DigitChar::Dot;
                        stream += DigitUtils::DigitChar::Zero;
                    } else {
                        power = diff;
                        ++power;
                    }
                } else if ((diff != 0) && (diff < SizeT{5})) {
                    insertZeros(stream, (diff - SizeT{1}));
                    stream += DigitUtils::DigitChar::Dot;
                    stream += DigitUtils::DigitChar::Zero;
                } else {
                    power = diff;
                }
            } else if (index < dot_index) {
                stream.InsertAt(DigitUtils::DigitChar::Dot, dot_index);
            } else {
                SizeT zeros = 0;

                if (power_increased) {
                    zeros = SizeT(number_length - fraction_length);
                } else {
                    const SizeT rem    = (index - started_at);
                    const SizeT needed = SizeT(number_length - calculated_digits);

                    if (rem > needed) {
                        zeros = (rem - needed);
                    }
                }

                while (zeros != 0) {
                    --index;
                    storage[index] = DigitUtils::DigitChar::Zero;
                    --zeros;
                }
            }
        }

        stream.Reverse(started_at);
        stream.StepBack(index - started_at);

        if (power != 0) {
            stream.InsertAt(DigitUtils::DigitChar::Dot, (started_at + SizeT{1}));
            insertPowerOfTen(stream, power, is_positive_exp);
        }
    }